

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

JObject * __thiscall
pstack::JObject::field<char[12],unsigned_int,char>(JObject *this,char (*k) [12],uint *v,char *c)

{
  ostream *os;
  char *__s;
  size_t sVar1;
  JSON<pstack::Field<char[12],_unsigned_int>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[12],_unsigned_int> field;
  
  os = this->os;
  __s = this->sep;
  local_38 = (undefined1  [8])k;
  field.k = (char (*) [12])v;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  local_48.object = (Field<char[12],_unsigned_int> *)local_38;
  local_48.context = c;
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }